

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O0

void nn_surveyor_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_surveyor *surveyor;
  long local_28;
  
  if (in_RDI == 0) {
    local_28 = 0;
  }
  else {
    local_28 = in_RDI + -0x1b0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    nn_timer_stop((nn_timer *)0x14259e);
    *(undefined4 *)(local_28 + 0x208) = 6;
  }
  if (*(int *)(local_28 + 0x208) == 6) {
    iVar1 = nn_timer_isidle((nn_timer *)0x1425da);
    if (iVar1 != 0) {
      *(undefined4 *)(local_28 + 0x208) = 1;
      nn_fsm_stopped_noevent((nn_fsm *)0x142604);
      nn_sockbase_stopped((nn_sockbase *)0x14260e);
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)(local_28 + 0x208),(ulong)in_ESI,(ulong)in_EDX,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/surveyor.c"
          ,0x150);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_surveyor_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, fsm);

    if (nn_slow (src== NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_timer_stop (&surveyor->timer);
        surveyor->state = NN_SURVEYOR_STATE_STOPPING;
    }
    if (nn_slow (surveyor->state == NN_SURVEYOR_STATE_STOPPING)) {
        if (!nn_timer_isidle (&surveyor->timer))
            return;
        surveyor->state = NN_SURVEYOR_STATE_IDLE;
        nn_fsm_stopped_noevent (&surveyor->fsm);
        nn_sockbase_stopped (&surveyor->xsurveyor.sockbase);
        return;
    }

    nn_fsm_bad_state(surveyor->state, src, type);
}